

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall
r_exec::Group::_initiate_sln_propagation
          (Group *this,Code *object,double change,double source_sln_thr)

{
  long lVar1;
  Code *pCVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  uint16_t i;
  ushort uVar5;
  pointer pcVar6;
  double extraout_XMM0_Qa;
  ulong in_XMM0_Qb;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> path;
  Code *local_78;
  double local_70;
  _Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_> local_68;
  double local_48;
  double local_38;
  ulong uStack_30;
  
  local_38 = ABS(change);
  uStack_30 = in_XMM0_Qb & 0x7fffffffffffffff;
  local_78 = object;
  local_70 = source_sln_thr;
  local_48 = change;
  (*(object->super__Object)._vptr__Object[0x15])(object);
  if (extraout_XMM0_Qa < local_38) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::push_back
              ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)&local_68,&local_78);
    (*(local_78->super__Object)._vptr__Object[4])(local_78,0);
    cVar3 = r_code::Atom::getDescriptor();
    if (cVar3 == -0x3c) {
      uVar5 = 0;
      while( true ) {
        iVar4 = (*(local_78->super__Object)._vptr__Object[10])();
        if ((ushort)iVar4 <= uVar5) break;
        iVar4 = (*(local_78->super__Object)._vptr__Object[9])(local_78,(ulong)uVar5);
        _propagate_sln(this,(Code *)CONCAT44(extraout_var,iVar4),local_48,local_70,
                       (vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)&local_68);
        uVar5 = uVar5 + 1;
      }
    }
    (*(local_78->super__Object)._vptr__Object[0x13])();
    pCVar2 = local_78;
    pcVar6 = (pointer)&(local_78->markers).used_cells_head;
    while (lVar1 = pcVar6->next, lVar1 != -1) {
      _propagate_sln(this,(pCVar2->markers).cells.
                          super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar1].data,local_48,local_70,
                     (vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)&local_68);
      pcVar6 = (pCVar2->markers).cells.
               super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar1;
    }
    (*(local_78->super__Object)._vptr__Object[0x14])();
    std::_Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>::~_Vector_base(&local_68);
  }
  return;
}

Assistant:

void Group::_initiate_sln_propagation(Code *object, double change, double source_sln_thr) const
{
    if (fabs(change) > object->get_psln_thr()) {
        std::vector<Code *> path;
        path.push_back(object);

        if (object->code(0).getDescriptor() == Atom::MARKER) { // if marker, propagate to references.
            for (uint16_t i = 0; i < object->references_size(); ++i) {
                _propagate_sln(object->get_reference(i), change, source_sln_thr, path);
            }
        }

        // propagate to markers
        object->acq_markers();
        r_code::list<Code *>::const_iterator m;

        for (m = object->markers.begin(); m != object->markers.end(); ++m) {
            _propagate_sln(*m, change, source_sln_thr, path);
        }

        object->rel_markers();
    }
}